

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucharstrie.cpp
# Opt level: O0

UChar * icu_63::UCharsTrie::findUniqueValueFromBranch
                  (UChar *pos,int32_t length,UBool haveUniqueValue,int32_t *uniqueValue)

{
  char16_t cVar1;
  UBool UVar2;
  uint leadUnit;
  int32_t iVar3;
  char16_t *pos_00;
  UChar *pUVar4;
  int32_t value;
  UBool isFinal;
  int32_t node;
  int32_t *uniqueValue_local;
  UBool haveUniqueValue_local;
  UChar *pUStack_18;
  int32_t length_local;
  UChar *pos_local;
  
  uniqueValue_local._4_4_ = length;
  pUStack_18 = pos;
  while (uniqueValue_local._3_1_ = haveUniqueValue, 5 < uniqueValue_local._4_4_) {
    pos_00 = jumpByDelta(pUStack_18 + 1);
    pUVar4 = findUniqueValueFromBranch
                       (pos_00,uniqueValue_local._4_4_ >> 1,haveUniqueValue,uniqueValue);
    if (pUVar4 == (UChar *)0x0) {
      return (UChar *)0x0;
    }
    uniqueValue_local._4_4_ = uniqueValue_local._4_4_ - (uniqueValue_local._4_4_ >> 1);
    pUStack_18 = skipDelta(pUStack_18 + 1);
  }
  do {
    cVar1 = pUStack_18[1];
    leadUnit = (ushort)cVar1 & 0x7fff;
    iVar3 = readValue(pUStack_18 + 2,leadUnit);
    pUStack_18 = skipValue(pUStack_18 + 2,leadUnit);
    if ((char)((int)(uint)(ushort)cVar1 >> 0xf) == '\0') {
      UVar2 = findUniqueValue(pUStack_18 + iVar3,uniqueValue_local._3_1_,uniqueValue);
      if (UVar2 == '\0') {
        return (UChar *)0x0;
      }
      uniqueValue_local._3_1_ = '\x01';
    }
    else if (uniqueValue_local._3_1_ == '\0') {
      *uniqueValue = iVar3;
      uniqueValue_local._3_1_ = '\x01';
    }
    else if (iVar3 != *uniqueValue) {
      return (UChar *)0x0;
    }
    uniqueValue_local._4_4_ = uniqueValue_local._4_4_ + -1;
  } while (1 < uniqueValue_local._4_4_);
  return pUStack_18 + 1;
}

Assistant:

const UChar *
UCharsTrie::findUniqueValueFromBranch(const UChar *pos, int32_t length,
                                      UBool haveUniqueValue, int32_t &uniqueValue) {
    while(length>kMaxBranchLinearSubNodeLength) {
        ++pos;  // ignore the comparison unit
        if(NULL==findUniqueValueFromBranch(jumpByDelta(pos), length>>1, haveUniqueValue, uniqueValue)) {
            return NULL;
        }
        length=length-(length>>1);
        pos=skipDelta(pos);
    }
    do {
        ++pos;  // ignore a comparison unit
        // handle its value
        int32_t node=*pos++;
        UBool isFinal=(UBool)(node>>15);
        node&=0x7fff;
        int32_t value=readValue(pos, node);
        pos=skipValue(pos, node);
        if(isFinal) {
            if(haveUniqueValue) {
                if(value!=uniqueValue) {
                    return NULL;
                }
            } else {
                uniqueValue=value;
                haveUniqueValue=TRUE;
            }
        } else {
            if(!findUniqueValue(pos+value, haveUniqueValue, uniqueValue)) {
                return NULL;
            }
            haveUniqueValue=TRUE;
        }
    } while(--length>1);
    return pos+1;  // ignore the last comparison unit
}